

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

function_record * pybind11::class_<sdf_tools::int3>::get_function_record(handle h)

{
  PyTypeObject *in_RAX;
  function_record *pfVar1;
  handle local_18;
  
  if ((h.m_ptr != (PyObject *)0x0) &&
     ((h.m_ptr)->ob_type == (PyTypeObject *)&PyInstanceMethod_Type ||
      (h.m_ptr)->ob_type == (PyTypeObject *)&PyMethod_Type)) {
    h.m_ptr = (PyObject *)h.m_ptr[1].ob_refcnt;
  }
  if (h.m_ptr == (PyObject *)0x0) {
    pfVar1 = (function_record *)0x0;
    local_18.m_ptr = (PyObject *)in_RAX;
  }
  else {
    if ((*(byte *)(h.m_ptr[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_18.m_ptr = (PyObject *)h.m_ptr[1].ob_type;
    }
    else {
      local_18.m_ptr = (PyObject *)0x0;
    }
    if ((PyTypeObject *)local_18.m_ptr != (PyTypeObject *)0x0) {
      (((PyTypeObject *)local_18.m_ptr)->ob_base).ob_base.ob_refcnt =
           (((PyTypeObject *)local_18.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar1 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&local_18);
  }
  if (h.m_ptr != (PyObject *)0x0) {
    object::~object((object *)&local_18);
  }
  return pfVar1;
}

Assistant:

static detail::function_record *get_function_record(handle h) {
        h = detail::get_function(h);
        return h ? (detail::function_record *) reinterpret_borrow<capsule>(PyCFunction_GET_SELF(h.ptr()))
                 : nullptr;
    }